

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_run_end(XmlReporter *this,TestRunStats *p)

{
  XmlWriter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  long in_RSI;
  long in_RDI;
  uint *in_stack_00000010;
  string *in_stack_00000018;
  XmlWriter *in_stack_00000020;
  string *in_stack_fffffffffffffe48;
  XmlWriter *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  ScopedElement *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe70;
  XmlWriter *in_stack_fffffffffffffe78;
  XmlWriter *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_139 [40];
  allocator<char> local_111 [33];
  int local_f0;
  allocator<char> local_e9 [40];
  allocator<char> local_c1 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_99;
  int local_78;
  allocator<char> local_71 [56];
  allocator<char> local_39 [41];
  long local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x80) != 0) {
    XmlWriter::endElement(in_stack_fffffffffffffe80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator<char> *)in_stack_fffffffffffffe80);
  XmlWriter::scopedElement(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator<char> *)in_stack_fffffffffffffe80);
  local_78 = *(int *)(local_10 + 0x10) - *(int *)(local_10 + 0x14);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(int *)in_stack_fffffffffffffe50);
  this_02 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,in_stack_fffffffffffffe88,(allocator<char> *)in_stack_fffffffffffffe80);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(int *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::allocator<char>::~allocator(local_71);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::allocator<char>::~allocator(local_39);
  this_00 = (XmlWriter *)(in_RDI + 8);
  __s = local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,(allocator<char> *)this_00)
  ;
  XmlWriter::startElement(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,(allocator<char> *)this_00)
  ;
  local_f0 = *(int *)(local_10 + 4) - *(int *)(local_10 + 0xc);
  XmlWriter::writeAttribute<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,(allocator<char> *)this_00)
  ;
  XmlWriter::writeAttribute<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::allocator<char>::~allocator(local_111);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::allocator<char>::~allocator(local_e9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::allocator<char>::~allocator(local_c1);
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x7f) & 1) == 0) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)__s,(allocator<char> *)this_00);
    XmlWriter::writeAttribute<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    std::__cxx11::string::~string(this_01);
    std::allocator<char>::~allocator(local_139);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(tc) // the TestSuite tag - only if there has been at least 1 test case
                xml.endElement();

            xml.scopedElement("OverallResultsAsserts")
                    .writeAttribute("successes", p.numAsserts - p.numAssertsFailed)
                    .writeAttribute("failures", p.numAssertsFailed);

            xml.startElement("OverallResultsTestCases")
                    .writeAttribute("successes",
                                    p.numTestCasesPassingFilters - p.numTestCasesFailed)
                    .writeAttribute("failures", p.numTestCasesFailed);
            if(opt.no_skipped_summary == false)
                xml.writeAttribute("skipped", p.numTestCases - p.numTestCasesPassingFilters);
            xml.endElement();

            xml.endElement();
        }